

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

Object * __thiscall nvim::Nvim::get_vvar(Object *__return_storage_ptr__,Nvim *this,string *name)

{
  allocator local_39;
  string local_38;
  
  (__return_storage_ptr__->super_variant<_cf2d41c5_>).which_ = 0;
  std::__cxx11::string::string((string *)&local_38,"nvim_get_vvar",&local_39);
  NvimRPC::call<std::__cxx11::string>(&this->client_,&local_38,__return_storage_ptr__,name);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Object Nvim::get_vvar(const std::string& name) {
    Object res;
    client_.call("nvim_get_vvar", res, name);
    return res;
}